

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregate_executor.hpp
# Opt level: O2

void duckdb::AggregateExecutor::
     UnaryUpdateLoop<duckdb::udf_avg_state_t<int>,int,duckdb::UDFAverageFunction>
               (int *idata,AggregateInputData *aggr_input_data,udf_avg_state_t<int> *state,
               idx_t count,ValidityMask *mask,SelectionVector *sel_vector)

{
  long lVar1;
  bool bVar2;
  idx_t i_1;
  idx_t iVar3;
  idx_t i;
  idx_t iVar4;
  
  lVar1 = *(long *)sel_vector;
  if ((mask->super_TemplatedValidityMask<unsigned_long>).validity_mask == (unsigned_long *)0x0) {
    for (iVar4 = 0; count != iVar4; iVar4 = iVar4 + 1) {
      iVar3 = iVar4;
      if (lVar1 != 0) {
        iVar3 = (idx_t)*(uint *)(lVar1 + iVar4 * 4);
      }
      state->sum = state->sum + idata[iVar3];
      state->count = state->count + 1;
    }
  }
  else {
    for (iVar4 = 0; count != iVar4; iVar4 = iVar4 + 1) {
      iVar3 = iVar4;
      if (lVar1 != 0) {
        iVar3 = (idx_t)*(uint *)(lVar1 + iVar4 * 4);
      }
      bVar2 = TemplatedValidityMask<unsigned_long>::RowIsValid
                        (&mask->super_TemplatedValidityMask<unsigned_long>,iVar3);
      if (bVar2) {
        state->sum = state->sum + idata[iVar3];
        state->count = state->count + 1;
      }
    }
  }
  return;
}

Assistant:

static inline void UnaryUpdateLoop(const INPUT_TYPE *__restrict idata, AggregateInputData &aggr_input_data,
	                                   STATE_TYPE *__restrict state, idx_t count, ValidityMask &mask,
	                                   const SelectionVector &__restrict sel_vector) {
		AggregateUnaryInput input(aggr_input_data, mask);
		if (OP::IgnoreNull() && !mask.AllValid()) {
			// potential NULL values and NULL values are ignored
			for (idx_t i = 0; i < count; i++) {
				input.input_idx = sel_vector.get_index(i);
				if (mask.RowIsValid(input.input_idx)) {
					OP::template Operation<INPUT_TYPE, STATE_TYPE, OP>(*state, idata[input.input_idx], input);
				}
			}
		} else {
			// quick path: no NULL values or NULL values are not ignored
			for (idx_t i = 0; i < count; i++) {
				input.input_idx = sel_vector.get_index(i);
				OP::template Operation<INPUT_TYPE, STATE_TYPE, OP>(*state, idata[input.input_idx], input);
			}
		}
	}